

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

bool __thiscall Polynom<Complex>::isOrdinal(Polynom<Complex> *this)

{
  uint uVar1;
  Complex *a;
  Matrix<Complex> *in_RDI;
  uint i;
  undefined2 in_stack_fffffffffffffeb8;
  byte in_stack_fffffffffffffeba;
  byte in_stack_fffffffffffffebb;
  undefined4 uVar2;
  BigInteger *a_00;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar3;
  MatrixRow<const_Complex_&> local_100 [7];
  MatrixRow<const_Complex_&> local_c8;
  BigInteger local_c0 [5];
  MatrixRow<const_Complex_&> local_20;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    uVar3 = local_14;
    uVar1 = Matrix<Complex>::width(in_RDI);
    if (uVar1 <= uVar3) {
      return true;
    }
    uVar2 = 0;
    local_20.arr = (Complex *)
                   Matrix<Complex>::operator[]
                             ((Matrix<Complex> *)
                              (ulong)CONCAT13(in_stack_fffffffffffffebb,
                                              CONCAT12(in_stack_fffffffffffffeba,
                                                       in_stack_fffffffffffffeb8)),0);
    a = Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](&local_20,local_14);
    local_c8.arr = (Complex *)
                   Matrix<Complex>::operator[]
                             ((Matrix<Complex> *)
                              CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                                      CONCAT12(in_stack_fffffffffffffeba,
                                                               in_stack_fffffffffffffeb8))),0);
    Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](&local_c8,local_14);
    a_00 = local_c0;
    Complex::operator_cast_to_BigInteger
              ((Complex *)
               CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                       CONCAT12(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8)
                                      )));
    Complex::Complex((Complex *)CONCAT44(uVar3,in_stack_fffffffffffffed0),a_00);
    in_stack_fffffffffffffebb =
         ::operator!=(a,(Complex *)
                        CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                                CONCAT12(in_stack_fffffffffffffeba,
                                                         in_stack_fffffffffffffeb8))));
    Complex::~Complex(a);
    BigInteger::~BigInteger((BigInteger *)0x180600);
    if ((in_stack_fffffffffffffebb & 1) != 0) break;
    local_100[0].arr =
         (Complex *)
         Matrix<Complex>::operator[]
                   ((Matrix<Complex> *)
                    CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                            CONCAT12(in_stack_fffffffffffffeba,
                                                     in_stack_fffffffffffffeb8))),0);
    Matrix<Complex>::MatrixRow<const_Complex_&>::operator[](local_100,local_14);
    Complex::operator_cast_to_BigInteger
              ((Complex *)
               CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                       CONCAT12(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8)
                                      )));
    BigInteger::BigInteger((BigInteger *)CONCAT44(uVar3,in_stack_fffffffffffffed0),(longlong)a_00);
    in_stack_fffffffffffffeba =
         operator<((BigInteger *)a,
                   (BigInteger *)
                   CONCAT44(uVar2,CONCAT13(in_stack_fffffffffffffebb,
                                           CONCAT12(in_stack_fffffffffffffeba,
                                                    in_stack_fffffffffffffeb8))));
    BigInteger::~BigInteger((BigInteger *)0x1806ae);
    BigInteger::~BigInteger((BigInteger *)0x1806b8);
    if ((in_stack_fffffffffffffeba & 1) != 0) {
      return false;
    }
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool Polynom<Field>::isOrdinal() const
{
    for(unsigned i = 0; i < m.width(); ++i)
    {
        if(m[0][i] != BigInteger(m[0][i]))
            return false;
        if(BigInteger(m[0][i]) < 0)
            return false;
    }
    return true;
}